

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBidec.c
# Opt level: O2

Hop_Obj_t *
Abc_NodeIfNodeResyn(Bdc_Man_t *p,Hop_Man_t *pHop,Hop_Obj_t *pRoot,int nVars,Vec_Int_t *vTruth,
                   uint *puCare,float dProb)

{
  float fVar1;
  uint __line;
  uint *pOut;
  ulong uVar2;
  Bdc_Fun_t *pBVar3;
  void *pCopy;
  Bdc_Fun_t *pBVar4;
  Hop_Obj_t *pHVar5;
  Hop_Obj_t *p1;
  int iVar6;
  char *__assertion;
  int iVar7;
  bool bVar8;
  
  if (0x10 < nVars) {
    __assertion = "nVars <= 16";
    __line = 0x36;
LAB_00263fa5:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBidec.c"
                  ,__line,
                  "Hop_Obj_t *Abc_NodeIfNodeResyn(Bdc_Man_t *, Hop_Man_t *, Hop_Obj_t *, int, Vec_Int_t *, unsigned int *, float)"
                 );
  }
  pOut = Hop_ManConvertAigToTruth
                   (pHop,(Hop_Obj_t *)((ulong)pRoot & 0xfffffffffffffffe),nVars,vTruth,0);
  if (((ulong)pRoot & 1) != 0) {
    Extra_TruthNot(pOut,pOut,nVars);
  }
  if (0.0 <= dProb) {
    fVar1 = (1.0 - dProb) * (dProb + dProb);
    if ((fVar1 < 0.0) || (0.5 < fVar1)) {
      __assertion = "Prob >= 0.0 && Prob <= 0.5";
      __line = 0x3f;
      goto LAB_00263fa5;
    }
    if (0.4 <= fVar1) {
      Extra_TruthNot(puCare,puCare,nVars);
      uVar2 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
      if (nVars < 6) {
        uVar2 = 1;
      }
      if (dProb <= 0.5) {
        for (; 0 < (long)uVar2; uVar2 = uVar2 - 1) {
          pOut[uVar2 - 1] = pOut[uVar2 - 1] & ~puCare[uVar2 - 1];
        }
      }
      else {
        for (; 0 < (long)uVar2; uVar2 = uVar2 - 1) {
          pOut[uVar2 - 1] = pOut[uVar2 - 1] | puCare[uVar2 - 1];
        }
      }
      Extra_TruthNot(puCare,puCare,nVars);
      puCare = (uint *)0x0;
    }
  }
  Bdc_ManDecompose(p,pOut,puCare,nVars,(Vec_Ptr_t *)0x0,1000);
  pBVar3 = Bdc_ManFunc(p,0);
  Bdc_FuncSetCopy(pBVar3,pHop->pConst1);
  iVar7 = 0;
  iVar6 = 0;
  if (0 < nVars) {
    iVar7 = nVars;
    iVar6 = 0;
  }
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    pBVar3 = Bdc_ManFunc(p,iVar6 + 1);
    pCopy = Vec_PtrEntry(pHop->vPis,iVar6);
    Bdc_FuncSetCopy(pBVar3,pCopy);
    iVar6 = iVar6 + 1;
  }
  iVar7 = Bdc_ManNodeNum(p);
  for (iVar6 = nVars + 1; iVar6 < iVar7; iVar6 = iVar6 + 1) {
    pBVar3 = Bdc_ManFunc(p,iVar6);
    pBVar4 = Bdc_FuncFanin0(pBVar3);
    pHVar5 = Bdc_FunCopyHop(pBVar4);
    pBVar4 = Bdc_FuncFanin1(pBVar3);
    p1 = Bdc_FunCopyHop(pBVar4);
    pHVar5 = Hop_And(pHop,pHVar5,p1);
    Bdc_FuncSetCopy(pBVar3,pHVar5);
  }
  pBVar3 = Bdc_ManRoot(p);
  pHVar5 = Bdc_FunCopyHop(pBVar3);
  return pHVar5;
}

Assistant:

Hop_Obj_t * Abc_NodeIfNodeResyn( Bdc_Man_t * p, Hop_Man_t * pHop, Hop_Obj_t * pRoot, int nVars, Vec_Int_t * vTruth, unsigned * puCare, float dProb )
{
    unsigned * pTruth;
    Bdc_Fun_t * pFunc;
    int nNodes, i;
    assert( nVars <= 16 );
    // derive truth table
    pTruth = Hop_ManConvertAigToTruth( pHop, Hop_Regular(pRoot), nVars, vTruth, 0 );
    if ( Hop_IsComplement(pRoot) )
        Extra_TruthNot( pTruth, pTruth, nVars );
    // perform power-aware decomposition
    if ( dProb >= 0.0 )
    {
        float Prob = (float)2.0 * dProb * (1.0 - dProb);
        assert( Prob >= 0.0 && Prob <= 0.5 );
        if ( Prob >= 0.4 )
        {
            Extra_TruthNot( puCare, puCare, nVars );
            if ( dProb > 0.5 ) // more 1s than 0s
                Extra_TruthOr( pTruth, pTruth, puCare, nVars );
            else
                Extra_TruthSharp( pTruth, pTruth, puCare, nVars );
            Extra_TruthNot( puCare, puCare, nVars );
            // decompose truth table
            Bdc_ManDecompose( p, pTruth, NULL, nVars, NULL, 1000 );
        }
        else
        {
            // decompose truth table
            Bdc_ManDecompose( p, pTruth, puCare, nVars, NULL, 1000 );
        }
    }
    else
    {
        // decompose truth table
        Bdc_ManDecompose( p, pTruth, puCare, nVars, NULL, 1000 );
    }
    // convert back into HOP
    Bdc_FuncSetCopy( Bdc_ManFunc( p, 0 ), Hop_ManConst1( pHop ) );
    for ( i = 0; i < nVars; i++ )
        Bdc_FuncSetCopy( Bdc_ManFunc( p, i+1 ), Hop_ManPi( pHop, i ) );
    nNodes = Bdc_ManNodeNum(p);
    for ( i = nVars + 1; i < nNodes; i++ )
    {
        pFunc = Bdc_ManFunc( p, i );
        Bdc_FuncSetCopy( pFunc, Hop_And( pHop, Bdc_FunCopyHop(Bdc_FuncFanin0(pFunc)), Bdc_FunCopyHop(Bdc_FuncFanin1(pFunc)) ) );
    }
    return Bdc_FunCopyHop( Bdc_ManRoot(p) );
}